

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::GTestFlagSaver::GTestFlagSaver(GTestFlagSaver *this)

{
  (this->output_).c_str_ = (char *)0x0;
  (this->output_).length_ = 0;
  (this->color_).c_str_ = (char *)0x0;
  (this->color_).length_ = 0;
  (this->death_test_style_).c_str_ = (char *)0x0;
  (this->death_test_style_).length_ = 0;
  (this->filter_).c_str_ = (char *)0x0;
  (this->filter_).length_ = 0;
  (this->internal_run_death_test_).c_str_ = (char *)0x0;
  (this->internal_run_death_test_).length_ = 0;
  this->also_run_disabled_tests_ = (bool)FLAGS_gtest_also_run_disabled_tests;
  this->break_on_failure_ = (bool)FLAGS_gtest_break_on_failure;
  this->catch_exceptions_ = (bool)FLAGS_gtest_catch_exceptions;
  String::operator=(&this->color_,(String *)&FLAGS_gtest_color);
  String::operator=(&this->death_test_style_,(String *)&FLAGS_gtest_death_test_style);
  this->death_test_use_fork_ = (bool)FLAGS_gtest_death_test_use_fork;
  String::operator=(&this->filter_,(String *)&FLAGS_gtest_filter);
  String::operator=(&this->internal_run_death_test_,(String *)&FLAGS_gtest_internal_run_death_test);
  this->list_tests_ = (bool)FLAGS_gtest_list_tests;
  String::operator=(&this->output_,(String *)&FLAGS_gtest_output);
  this->print_time_ = (bool)FLAGS_gtest_print_time;
  this->random_seed_ = FLAGS_gtest_random_seed;
  this->repeat_ = FLAGS_gtest_repeat;
  this->shuffle_ = (bool)FLAGS_gtest_shuffle;
  this->stack_trace_depth_ = FLAGS_gtest_stack_trace_depth;
  this->throw_on_failure_ = (bool)FLAGS_gtest_throw_on_failure;
  return;
}

Assistant:

GTestFlagSaver() {
    also_run_disabled_tests_ = GTEST_FLAG(also_run_disabled_tests);
    break_on_failure_ = GTEST_FLAG(break_on_failure);
    catch_exceptions_ = GTEST_FLAG(catch_exceptions);
    color_ = GTEST_FLAG(color);
    death_test_style_ = GTEST_FLAG(death_test_style);
    death_test_use_fork_ = GTEST_FLAG(death_test_use_fork);
    filter_ = GTEST_FLAG(filter);
    internal_run_death_test_ = GTEST_FLAG(internal_run_death_test);
    list_tests_ = GTEST_FLAG(list_tests);
    output_ = GTEST_FLAG(output);
    print_time_ = GTEST_FLAG(print_time);
    random_seed_ = GTEST_FLAG(random_seed);
    repeat_ = GTEST_FLAG(repeat);
    shuffle_ = GTEST_FLAG(shuffle);
    stack_trace_depth_ = GTEST_FLAG(stack_trace_depth);
    throw_on_failure_ = GTEST_FLAG(throw_on_failure);
  }